

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_3c;
  packet_t *ppStack_38;
  int i;
  packet_t *pkts [2];
  ip_tables_t *ipts;
  char *p;
  char **argv_local;
  int argc_local;
  
  ipts = (ip_tables_t *)anon_var_dwarf_23;
  if (argc == 2) {
    ipts = (ip_tables_t *)argv[1];
  }
  pkts[1] = (packet_t *)parse_tables((char *)ipts);
  print_tables((ip_tables_t *)pkts[1]);
  ppStack_38 = new_tcp_pkt("192.168.1.100","192.168.1.101",0x3039,0x50,'\x02');
  pkts[0] = new_tcp_pkt("192.168.1.101","192.168.1.100",0x3039,0x50,'\x02');
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    pkt_set_iface(*(packet_t **)((long)&stack0xffffffffffffffc8 + (long)local_3c * 8),"ens33",
                  (char *)0x0);
    if (*(long *)((long)&stack0xffffffffffffffc8 + (long)local_3c * 8) != 0) {
      *(undefined1 *)(*(long *)((long)&stack0xffffffffffffffc8 + (long)local_3c * 8) + 0x38) = 2;
    }
    print_pkt(*(packet_t **)((long)&stack0xffffffffffffffc8 + (long)local_3c * 8));
    iVar1 = match_tables((ip_tables_t *)pkts[1],
                         *(packet_t **)((long)&stack0xffffffffffffffc8 + (long)local_3c * 8),
                         (ip_opt_t *)0x0);
    pcVar2 = "DROP";
    if (iVar1 != 0) {
      pcVar2 = "ACCEPT";
    }
    printf("match result\t: %s\n",pcVar2);
    free_pkt(*(packet_t **)((long)&stack0xffffffffffffffc8 + (long)local_3c * 8));
  }
  free_tables((ip_tables_t *)pkts[1]);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	char *p = "../test.txt";

	if (argc == 2) {
		p = argv[1];
	}

	ip_tables_t *ipts = parse_tables(p);
	print_tables(ipts);

	packet_t *pkts[2];

	pkts[0] = new_tcp_pkt("192.168.1.100", "192.168.1.101", 12345, 80, TCP_SYN);
	pkts[1] = new_tcp_pkt("192.168.1.101", "192.168.1.100", 12345, 80, TCP_SYN);

	//pkts[0] = new_udp_pkt("192.168.1.100", "192.168.1.101", 12345, 80);
	//pkts[1] = new_udp_pkt("192.168.1.101", "192.168.1.100", 12345, 80);

	for (int i = 0; i < 2; i++) {

		pkt_set_iface(pkts[i], "ens33", NULL);
		pkt_set_state(pkts[i], STATE_NEW);
		print_pkt(pkts[i]);
		printf("match result\t: %s\n", match_tables(ipts, pkts[i], NULL) ? "ACCEPT" : "DROP");
		free_pkt(pkts[i]);
	}


	free_tables(ipts);
	return 0;
}